

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_echo.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  LIBSSH2_CHANNEL *pLVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 *puVar9;
  long lVar10;
  ulong uVar11;
  ulong local_7e40;
  char *local_7e08;
  ssize_t n_1;
  size_t size;
  size_t left;
  ssize_t n;
  int act;
  int i;
  int rewrites;
  int rereads;
  size_t totread;
  size_t totwritten;
  size_t totsize;
  char buffer [32000];
  size_t bufsize;
  int running;
  LIBSSH2_POLLFD *fds;
  long lStack_80;
  int check;
  libssh2_knownhost *host;
  long lStack_70;
  int type;
  LIBSSH2_KNOWNHOSTS *nh;
  size_t len;
  char *exitsignal;
  long lStack_50;
  int exitcode;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  long lStack_38;
  int rc;
  char *fingerprint;
  sockaddr_in sin;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  channel = (LIBSSH2_CHANNEL *)0x0;
  exitsignal._4_4_ = 0;
  len = (size_t)anon_var_dwarf_23;
  if (1 < argc) {
    hostname = argv[1];
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  session._4_4_ = libssh2_init(0);
  if (session._4_4_ != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)session._4_4_);
    return 1;
  }
  sin.sin_zero._4_4_ = inet_addr(hostname);
  sin.sin_zero._0_4_ = socket(2,1,0);
  if (sin.sin_zero._0_4_ == -1) {
    fprintf(_stderr,"failed to create socket.\n");
  }
  else {
    fingerprint._0_2_ = 2;
    fingerprint._2_2_ = htons(0x16);
    fingerprint._4_1_ = sin.sin_zero[4];
    fingerprint._5_1_ = sin.sin_zero[5];
    fingerprint._6_1_ = sin.sin_zero[6];
    fingerprint._7_1_ = sin.sin_zero[7];
    iVar5 = connect(sin.sin_zero._0_4_,(sockaddr *)&fingerprint,0x10);
    if (iVar5 == 0) {
      channel = (LIBSSH2_CHANNEL *)libssh2_session_init_ex(0,0,0);
      if (channel == (LIBSSH2_CHANNEL *)0x0) {
        fprintf(_stderr,"Could not initialize SSH session.\n");
      }
      else {
        libssh2_session_set_blocking(channel,0);
        while (session._4_4_ = libssh2_session_handshake(channel,sin.sin_zero._0_4_),
              session._4_4_ == 0xffffffdb) {
          session._4_4_ = 0xffffffdb;
        }
        if (session._4_4_ == 0) {
          lStack_70 = libssh2_knownhost_init(channel);
          if (lStack_70 == 0) {
            return 2;
          }
          libssh2_knownhost_readfile(lStack_70,"known_hosts",1);
          libssh2_knownhost_writefile(lStack_70,"dumpfile",1);
          lStack_38 = libssh2_session_hostkey(channel,&nh,(long)&host + 4);
          if (lStack_38 == 0) {
            return 3;
          }
          puVar9 = (undefined1 *)&stack0xffffffffffffff80;
          uVar6 = libssh2_knownhost_checkp(lStack_70,hostname,0x16,lStack_38,nh,0x10001,puVar9);
          if ((int)uVar6 < 2) {
            local_7e08 = *(char **)(lStack_80 + 0x18);
          }
          else {
            local_7e08 = "<none>";
          }
          fprintf(_stderr,"Host check: %d, key: %s\n",(ulong)uVar6,local_7e08);
          libssh2_knownhost_free(lStack_70);
          sVar7 = strlen(password);
          if (sVar7 != 0) {
            while( true ) {
              pLVar4 = channel;
              pcVar2 = username;
              sVar7 = strlen(username);
              pcVar3 = password;
              sVar8 = strlen(password);
              session._4_4_ =
                   libssh2_userauth_password_ex
                             (pLVar4,pcVar2,sVar7 & 0xffffffff,pcVar3,sVar8 & 0xffffffff,0);
              if (session._4_4_ != -0x25) break;
              session._4_4_ = 0xffffffdb;
            }
            if (session._4_4_ != 0) {
              fprintf(_stderr,"Authentication by password failed.\n");
              exit(1);
            }
            session._4_4_ = 0;
          }
          libssh2_trace(channel,0x200);
          while( true ) {
            puVar9 = (undefined1 *)((ulong)puVar9 & 0xffffffff00000000);
            lStack_50 = libssh2_channel_open_ex(channel,"session",7,0x200000,0x8000,0,puVar9);
            if ((lStack_50 != 0) ||
               (iVar5 = libssh2_session_last_error(channel,0,0,0), iVar5 != -0x25)) break;
            waitsocket(sin.sin_zero._0_4_,(LIBSSH2_SESSION *)channel);
          }
          if (lStack_50 == 0) {
            fprintf(_stderr,"Error\n");
            exit(1);
          }
          while( true ) {
            lVar10 = lStack_50;
            pcVar2 = commandline;
            sVar7 = strlen(commandline);
            session._4_4_ =
                 libssh2_channel_process_startup(lVar10,"exec",4,pcVar2,sVar7 & 0xffffffff);
            if (session._4_4_ != 0xffffffdb) break;
            waitsocket(sin.sin_zero._0_4_,(LIBSSH2_SESSION *)channel);
          }
          if (session._4_4_ != 0) {
            fprintf(_stderr,"exec error\n");
            exit(1);
          }
          bVar1 = true;
          totread = 0;
          _rewrites = 0;
          i = 0;
          act = 0;
          for (n._4_4_ = 0; n._4_4_ < 32000; n._4_4_ = n._4_4_ + 1) {
            buffer[(long)n._4_4_ + -8] = 'A';
          }
          puVar9 = (undefined1 *)malloc(0x20);
          if (puVar9 == (undefined1 *)0x0) {
            fprintf(_stderr,"malloc failed\n");
            exit(1);
          }
          *puVar9 = 2;
          *(long *)(puVar9 + 8) = lStack_50;
          *(undefined8 *)(puVar9 + 0x10) = 5;
          do {
            n._0_4_ = 0;
            session._4_4_ = libssh2_poll(puVar9,1,10);
            if (0 < (int)session._4_4_) {
              if ((*(ulong *)(puVar9 + 0x18) & 1) != 0) {
                lVar10 = libssh2_channel_read_ex(lStack_50,0,&totsize,32000);
                n._0_4_ = 1;
                if (lVar10 == -0x25) {
                  i = i + 1;
                  fprintf(_stderr,"will read again\n");
                }
                else {
                  if (lVar10 < 0) {
                    fprintf(_stderr,"read failed\n");
                    exit(1);
                  }
                  _rewrites = lVar10 + _rewrites;
                  fprintf(_stderr,"read %ld bytes (%lu in total)\n",lVar10,_rewrites);
                }
              }
              if ((*(ulong *)(puVar9 + 0x18) & 4) != 0) {
                n._0_4_ = (int)n + 1;
                if (totread < 1500000) {
                  uVar11 = 1500000 - totread;
                  local_7e40 = uVar11;
                  if (31999 < uVar11) {
                    local_7e40 = 32000;
                  }
                  lVar10 = libssh2_channel_write_ex(lStack_50,0,&totsize,local_7e40);
                  if (lVar10 == -0x25) {
                    act = act + 1;
                    fprintf(_stderr,"will write again\n");
                  }
                  else {
                    if (lVar10 < 0) {
                      fprintf(_stderr,"write failed\n");
                      exit(1);
                    }
                    totread = lVar10 + totread;
                    fprintf(_stderr,"wrote %ld bytes (%lu in total)",lVar10,totread);
                    if ((31999 < uVar11) && (lVar10 != 32000)) {
                      fprintf(_stderr," PARTIAL");
                    }
                    fprintf(_stderr,"\n");
                  }
                }
                else {
                  session._4_4_ = libssh2_channel_send_eof(lStack_50);
                  if (session._4_4_ == 0xffffffdb) {
                    fprintf(_stderr,"will send eof again\n");
                  }
                  else {
                    if ((int)session._4_4_ < 0) {
                      fprintf(_stderr,"send eof failed\n");
                      exit(1);
                    }
                    fprintf(_stderr,"sent eof\n");
                    *(ulong *)(puVar9 + 0x10) = *(ulong *)(puVar9 + 0x10) & 0xfffffffffffffffb;
                  }
                }
              }
              if (((*(ulong *)(puVar9 + 0x18) & 0x80) != 0) && ((int)n == 0)) {
                bVar1 = false;
              }
            }
          } while (bVar1);
          exitsignal._4_4_ = 0x7f;
          while (session._4_4_ = libssh2_channel_close(lStack_50), session._4_4_ == 0xffffffdb) {
            waitsocket(sin.sin_zero._0_4_,(LIBSSH2_SESSION *)channel);
          }
          if (session._4_4_ == 0) {
            exitsignal._4_4_ = libssh2_channel_get_exit_status(lStack_50);
            libssh2_channel_get_exit_signal(lStack_50,&len,0,0,0,0,0);
          }
          if (len != 0) {
            fprintf(_stderr,"\nGot signal: %s\n",len);
          }
          libssh2_channel_free(lStack_50);
          lStack_50 = 0;
          fprintf(_stderr,"\nrereads: %d rewrites: %d totwritten %lu\n",(ulong)(uint)i,
                  (ulong)(uint)act,totread);
          if (totread != _rewrites) {
            fprintf(_stderr,"\n*** FAIL bytes written: %lu bytes read: %lu ***\n",totread,_rewrites)
            ;
            exit(1);
          }
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)session._4_4_);
        }
      }
    }
    else {
      fprintf(_stderr,"failed to connect.\n");
    }
  }
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    libssh2_session_disconnect_ex(channel,0xb,"Normal Shutdown","");
    libssh2_session_free(channel);
  }
  if (sin.sin_zero._0_4_ != -1) {
    shutdown(sin.sin_zero._0_4_,2);
    close(sin.sin_zero._0_4_);
  }
  fprintf(_stderr,"all done\n");
  libssh2_exit();
  return exitsignal._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    int exitcode = 0;
    char *exitsignal = (char *)"none";
    size_t len;
    LIBSSH2_KNOWNHOSTS *nh;
    int type;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostname = argv[1];  /* must be ip address only */
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    hostaddr = inet_addr(hostname);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* tell libssh2 we want it all done non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    nh = libssh2_knownhost_init(session);
    if(!nh) {
        /* eeek, do cleanup here */
        return 2;
    }

    /* read all hosts from here */
    libssh2_knownhost_readfile(nh, "known_hosts",
                               LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    /* store all known hosts to here */
    libssh2_knownhost_writefile(nh, "dumpfile",
                                LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    fingerprint = libssh2_session_hostkey(session, &len, &type);
    if(fingerprint) {
        struct libssh2_knownhost *host;
        int check = libssh2_knownhost_checkp(nh, hostname, 22,
                                             fingerprint, len,
                                             LIBSSH2_KNOWNHOST_TYPE_PLAIN|
                                             LIBSSH2_KNOWNHOST_KEYENC_RAW,
                                             &host);

        fprintf(stderr, "Host check: %d, key: %s\n", check,
                (check <= LIBSSH2_KNOWNHOST_CHECK_MISMATCH) ?
                host->key : "<none>");

        /*****
         * At this point, we could verify that 'check' tells us the key is
         * fine or bail out.
         *****/
    }
    else {
        /* eeek, do cleanup here */
        return 3;
    }
    libssh2_knownhost_free(nh);

    if(strlen(password) != 0) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            exit(1);
        }
    }

    libssh2_trace(session, LIBSSH2_TRACE_SOCKET);

    /* Exec non-blocking on the remote host */
    do {
        channel = libssh2_channel_open_session(session);
        if(channel ||
           libssh2_session_last_error(session, NULL, NULL, 0) !=
           LIBSSH2_ERROR_EAGAIN)
            break;
        waitsocket(sock, session);
    } while(1);
    if(!channel) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    while((rc = libssh2_channel_exec(channel, commandline)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "exec error\n");
        exit(1);
    }
    else {
        LIBSSH2_POLLFD *fds = NULL;
        int running = 1;
        size_t bufsize = BUFSIZE;
        char buffer[BUFSIZE];
        size_t totsize = 1500000;
        size_t totwritten = 0;
        size_t totread = 0;
        int rereads = 0;
        int rewrites = 0;
        int i;

        for(i = 0; i < BUFSIZE; i++)
            buffer[i] = 'A';

        fds = malloc(sizeof(LIBSSH2_POLLFD));
        if(!fds) {
            fprintf(stderr, "malloc failed\n");
            exit(1);
        }

        fds[0].type = LIBSSH2_POLLFD_CHANNEL;
        fds[0].fd.channel = channel;
        fds[0].events = LIBSSH2_POLLFD_POLLIN | LIBSSH2_POLLFD_POLLOUT;

        do {
            int act = 0;
            rc = libssh2_poll(fds, 1, 10);

            if(rc < 1)
                continue;

            if(fds[0].revents & LIBSSH2_POLLFD_POLLIN) {
                ssize_t n = libssh2_channel_read(channel,
                                                 buffer, sizeof(buffer));
                act++;

                if(n == LIBSSH2_ERROR_EAGAIN) {
                    rereads++;
                    fprintf(stderr, "will read again\n");
                }
                else if(n < 0) {
                    fprintf(stderr, "read failed\n");
                    exit(1);
                }
                else {
                    totread += (size_t)n;
                    fprintf(stderr, "read %ld bytes (%lu in total)\n",
                            (long)n, (unsigned long)totread);
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_POLLOUT) {
                act++;

                if(totwritten < totsize) {
                    /* we have not written all data yet */
                    size_t left = totsize - totwritten;
                    size_t size = (left < bufsize) ? left : bufsize;
                    ssize_t n = libssh2_channel_write_ex(channel, 0,
                                                         buffer, size);

                    if(n == LIBSSH2_ERROR_EAGAIN) {
                        rewrites++;
                        fprintf(stderr, "will write again\n");
                    }
                    else if(n < 0) {
                        fprintf(stderr, "write failed\n");
                        exit(1);
                    }
                    else {
                        totwritten += (size_t)n;
                        fprintf(stderr, "wrote %ld bytes (%lu in total)",
                                (long)n, (unsigned long)totwritten);
                        if(left >= bufsize && (size_t)n != bufsize) {
                            fprintf(stderr, " PARTIAL");
                        }
                        fprintf(stderr, "\n");
                    }
                }
                else {
                    /* all data written, send EOF */
                    rc = libssh2_channel_send_eof(channel);

                    if(rc == LIBSSH2_ERROR_EAGAIN) {
                        fprintf(stderr, "will send eof again\n");
                    }
                    else if(rc < 0) {
                        fprintf(stderr, "send eof failed\n");
                        exit(1);
                    }
                    else {
                        fprintf(stderr, "sent eof\n");
                        /* we're done writing, stop listening for OUT events */
                        fds[0].events &=
                            ~(unsigned long)LIBSSH2_POLLFD_POLLOUT;
                    }
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_CHANNEL_CLOSED) {
                if(!act) /* don't leave loop until we have read all data */
                    running = 0;
            }
        } while(running);

        exitcode = 127;
        while((rc = libssh2_channel_close(channel)) == LIBSSH2_ERROR_EAGAIN)
            waitsocket(sock, session);

        if(rc == 0) {
            exitcode = libssh2_channel_get_exit_status(channel);
            libssh2_channel_get_exit_signal(channel, &exitsignal,
                                            NULL, NULL, NULL, NULL, NULL);
        }

        if(exitsignal)
            fprintf(stderr, "\nGot signal: %s\n", exitsignal);

        libssh2_channel_free(channel);
        channel = NULL;

        fprintf(stderr, "\nrereads: %d rewrites: %d totwritten %lu\n",
                rereads, rewrites, (unsigned long)totwritten);

        if(totwritten != totread) {
            fprintf(stderr, "\n*** FAIL bytes written: "
                    "%lu bytes read: %lu ***\n",
                    (unsigned long)totwritten, (unsigned long)totread);
            exit(1);
        }
    }

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return exitcode;
}